

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
__thiscall ninx::parser::Parser::parse_block(Parser *this)

{
  char cVar1;
  int iVar2;
  Token *pTVar3;
  Limiter *pLVar4;
  ParserException *pPVar5;
  pointer *__ptr;
  string *in_RSI;
  string local_50;
  
  pTVar3 = TokenReader::get_token((TokenReader *)(in_RSI + 1));
  if (pTVar3 != (Token *)0x0) {
    iVar2 = (*pTVar3->_vptr_Token[2])(pTVar3);
    if (iVar2 == 1) {
      pLVar4 = (Limiter *)
               __dynamic_cast(pTVar3,&lexer::token::Token::typeinfo,&lexer::token::Limiter::typeinfo
                              ,0);
      cVar1 = lexer::token::Limiter::get_limiter(pLVar4);
      if (cVar1 == '{') {
        parse_implicit_block_until(this,(char)in_RSI);
        pTVar3 = TokenReader::get_token((TokenReader *)(in_RSI + 1));
        if (pTVar3 != (Token *)0x0) {
          iVar2 = (*pTVar3->_vptr_Token[2])(pTVar3);
          if (iVar2 == 1) {
            pLVar4 = (Limiter *)
                     __dynamic_cast(pTVar3,&lexer::token::Token::typeinfo,
                                    &lexer::token::Limiter::typeinfo,0);
            cVar1 = lexer::token::Limiter::get_limiter(pLVar4);
            if (cVar1 == '}') {
              return (__uniq_ptr_data<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>,_true,_true>
                      )(__uniq_ptr_data<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>,_true,_true>
                        )this;
            }
          }
        }
        pPVar5 = (ParserException *)__cxa_allocate_exception(0x20);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"Expected close bracket }, but could not find one.","");
        exception::ParserException::ParserException(pPVar5,pTVar3,in_RSI,&local_50);
        __cxa_throw(pPVar5,&exception::ParserException::typeinfo,std::runtime_error::~runtime_error)
        ;
      }
    }
  }
  pPVar5 = (ParserException *)__cxa_allocate_exception(0x20);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Expected open bracket {, but could not find one.","");
  exception::ParserException::ParserException(pPVar5,pTVar3,in_RSI,&local_50);
  __cxa_throw(pPVar5,&exception::ParserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::unique_ptr<Block> ninx::parser::Parser::parse_block() {
    Token *open_bracket{reader.get_token()};
    if (!open_bracket || open_bracket->get_type() != Type::LIMITER ||
        dynamic_cast<ninx::lexer::token::Limiter *>(open_bracket)->get_limiter() != '{') {
        throw ParserException(open_bracket, this->origin, "Expected open bracket {, but could not find one.");
    }

    auto block{parse_implicit_block()};

    Token *close_bracket{reader.get_token()};
    if (!close_bracket || close_bracket->get_type() != Type::LIMITER ||
        dynamic_cast<ninx::lexer::token::Limiter *>(close_bracket)->get_limiter() != '}') {
        throw ParserException(close_bracket, this->origin, "Expected close bracket }, but could not find one.");
    }

    return block;
}